

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall
flatbuffers::ts::TsGenerator::TrackNsDef(TsGenerator *this,Definition *definition,string *type_name)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Namespace *pNVar3;
  pointer pcVar4;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
  *this_00;
  long *plVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  size_type *psVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  *this_01;
  string path;
  string symbolic_name;
  string filepath;
  string def_mod_name;
  key_type local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
  local_110;
  undefined1 local_e8 [32];
  Definition *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  pNVar3 = definition->defined_namespace;
  pIVar1 = &this->namer_;
  if ((pNVar3->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pNVar3->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    (*(pIVar1->super_Namer)._vptr_Namer[0xc])(local_e8,pIVar1,definition,3);
    std::__cxx11::string::_M_assign((string *)&local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_58 + 8),(this->super_BaseGenerator).path_,&local_150);
    plVar5 = (long *)std::__cxx11::string::append(local_58 + 8);
    paVar2 = &local_110.first.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_110.first.field_2._M_allocated_capacity = *psVar8;
      local_110.first.field_2._8_8_ = plVar5[3];
      local_110.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.first.field_2._M_allocated_capacity = *psVar8;
      local_110.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_110.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._8_8_ != &local_40) {
      operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    }
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xd])(local_e8,pIVar1,pNVar3,2,1);
    std::__cxx11::string::operator=((string *)&local_170,(string *)local_e8);
    pcVar4 = local_e8 + 0x10;
    if ((pointer)local_e8._0_8_ != pcVar4) {
      operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    }
    local_e8._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    std::__cxx11::string::append(local_e8);
    std::__cxx11::string::operator=((string *)&local_130,(string *)local_e8);
    if ((pointer)local_e8._0_8_ != pcVar4) {
      operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    }
    (*(pIVar1->super_Namer)._vptr_Namer[0xd])(local_e8,pIVar1,definition->defined_namespace,3,1);
    std::__cxx11::string::operator=((string *)&local_170,(string *)local_e8);
    if ((pointer)local_e8._0_8_ != pcVar4) {
      operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_150);
  }
  this_01 = &this->ns_defs_;
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(this_01,&local_170);
  if (sVar6 == 0) {
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = 0;
    local_e8[0x10] = '\0';
    local_c0 = 0;
    local_b8[0] = 0;
    local_a8._8_8_ = 0;
    local_98 = 0;
    local_78.field_2._M_allocated_capacity = (size_type)&local_78;
    local_78._M_dataplus._M_p._0_4_ = 0;
    local_78._M_string_length = 0;
    local_58._0_8_ = 0;
    local_c8 = (Definition *)local_b8;
    local_a8._M_allocated_capacity = (size_type)(local_b8 + 0x20);
    local_78.field_2._8_8_ = local_78.field_2._M_allocated_capacity;
    std::__cxx11::string::_M_assign((string *)local_e8);
    std::__cxx11::string::_M_assign((string *)&local_c8);
    local_88._0_8_ = definition->defined_namespace;
    paVar2 = &local_110.first.field_2;
    pcVar4 = (type_name->_M_dataplus)._M_p;
    local_110.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar4,pcVar4 + type_name->_M_string_length);
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
               *)(local_b8 + 0x38);
    local_110.second = definition;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
              (this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)(local_b8 + 0x10));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](this_01,&local_170);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::_M_assign((string *)&pmVar7->filepath);
    std::__cxx11::string::_M_assign((string *)&pmVar7->symbolic_name);
    pmVar7->ns = (Namespace *)local_88._0_8_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
    ::operator=(&(pmVar7->definitions)._M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
                 *)this_00);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
                 *)this_00);
    if ((undefined1 *)local_a8._M_allocated_capacity != local_b8 + 0x20) {
      operator_delete((void *)local_a8._M_allocated_capacity,CONCAT71(uStack_97,local_98) + 1);
    }
    if (local_c8 != (Definition *)local_b8) {
      operator_delete(local_c8,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
    }
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) goto LAB_0025a267;
  }
  else {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](this_01,&local_170);
    pcVar4 = (type_name->_M_dataplus)._M_p;
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar4,pcVar4 + type_name->_M_string_length);
    local_c8 = definition;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
                *)&pmVar7->definitions,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
                *)local_e8);
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) goto LAB_0025a267;
  }
  operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
LAB_0025a267:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TrackNsDef(const Definition &definition, std::string type_name) {
    std::string path;
    std::string filepath;
    std::string symbolic_name;
    if (definition.defined_namespace->components.size() > 0) {
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::TrailingPathSeperator);
      filepath = path + ".ts";
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::OutputPathAndTrailingPathSeparator);
      symbolic_name = definition.defined_namespace->components.back();
    } else {
      auto def_mod_name = namer_.File(definition, SkipFile::SuffixAndExtension);
      symbolic_name = file_name_;
      filepath = path_ + symbolic_name + ".ts";
    }
    if (ns_defs_.count(path) == 0) {
      NsDefinition nsDef;
      nsDef.path = path;
      nsDef.filepath = filepath;
      nsDef.ns = definition.defined_namespace;
      nsDef.definitions.insert(std::make_pair(type_name, &definition));
      nsDef.symbolic_name = symbolic_name;
      ns_defs_[path] = nsDef;
    } else {
      ns_defs_[path].definitions.insert(std::make_pair(type_name, &definition));
    }
  }